

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O2

void __thiscall ViewTest::transposeTest<false>(ViewTest *this)

{
  int iVar1;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_00;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_01;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_02;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_03;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_04;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_05;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_06;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_07;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_08;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_09;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_10;
  reference piVar2;
  size_t x_7;
  int *data;
  size_t y_2;
  size_t x_3;
  size_t x;
  size_t sVar3;
  size_t x_1;
  unsigned_long uVar4;
  unsigned_long uVar5;
  size_t y;
  size_t sVar6;
  CoordinateOrder local_15c;
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape;
  allocator_type local_131;
  View<int,_false,_std::allocator<unsigned_long>_> w2;
  View<int,_false,_std::allocator<unsigned_long>_> w1;
  View<int,_false,_std::allocator<unsigned_long>_> v;
  View<int,_false,_std::allocator<unsigned_long>_> w3;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,2,(allocator_type *)&v);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 6;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 4;
  data = this->data_;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&w1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&w1,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&w2);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&w2,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&w3);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&w3,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&local_15c);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::transpose(&w1,0,1);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::transpose(&w2,0,0);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::transpose(&w3,1,1);
  for (sVar3 = 0; sVar3 != 6; sVar3 = sVar3 + 1) {
    for (sVar6 = 0; sVar6 != 4; sVar6 = sVar6 + 1) {
      piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)&v,sVar3,sVar6);
      iVar1 = *piVar2;
      piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)&w1,sVar6,sVar3);
      local_15c._0_1_ = iVar1 == *piVar2;
      test((bool *)&local_15c);
      piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)&v,sVar3,sVar6);
      iVar1 = *piVar2;
      piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)&w2,sVar3,sVar6);
      local_15c._0_1_ = iVar1 == *piVar2;
      test((bool *)&local_15c);
      piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)&v,sVar3,sVar6);
      iVar1 = *piVar2;
      piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)&w3,sVar3,sVar6);
      local_15c = CONCAT31(local_15c._1_3_,iVar1 == *piVar2);
      test((bool *)&local_15c);
    }
  }
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&w3.geometry_);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&w2.geometry_);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&w1.geometry_);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,2,(allocator_type *)&v);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 6;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 4;
  w1.data_._0_4_ = 0;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,(CoordinateOrder *)&w1,&andres::defaultOrder,
             (allocator_type *)&w2);
  w2.data_._0_4_ = 0;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&w1,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,(CoordinateOrder *)&w2,&andres::defaultOrder,
             (allocator_type *)&w3);
  w3.data_._0_4_ = 0;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&w2,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,(CoordinateOrder *)&w3,&andres::defaultOrder,
             (allocator_type *)&local_15c);
  local_15c = FirstMajorOrder;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&w3,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&local_15c,&andres::defaultOrder,&local_131);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::transpose(&w1,0,1);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::transpose(&w2,0,0);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::transpose(&w3,1,1);
  for (sVar3 = 0; sVar3 != 6; sVar3 = sVar3 + 1) {
    for (sVar6 = 0; sVar6 != 4; sVar6 = sVar6 + 1) {
      piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)&v,sVar3,sVar6);
      iVar1 = *piVar2;
      piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)&w1,sVar6,sVar3);
      local_15c._0_1_ = iVar1 == *piVar2;
      test((bool *)&local_15c);
      piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)&v,sVar3,sVar6);
      iVar1 = *piVar2;
      piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)&w2,sVar3,sVar6);
      local_15c._0_1_ = iVar1 == *piVar2;
      test((bool *)&local_15c);
      piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)&v,sVar3,sVar6);
      iVar1 = *piVar2;
      piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)&w3,sVar3,sVar6);
      local_15c = CONCAT31(local_15c._1_3_,iVar1 == *piVar2);
      test((bool *)&local_15c);
    }
  }
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&w3.geometry_);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&w2.geometry_);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&w1.geometry_);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&w2,3,(allocator_type *)&v);
  begin._M_current._4_4_ = w2.data_._4_4_;
  begin._M_current._0_4_ = w2.data_._0_4_;
  *begin._M_current = 3;
  begin._M_current[1] = 4;
  begin._M_current[2] = 2;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )w2.geometry_._0_8_,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&w1);
  begin_00._M_current._4_4_ = w2.data_._4_4_;
  begin_00._M_current._0_4_ = w2.data_._0_4_;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&w1,begin_00,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )w2.geometry_._0_8_,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&w3);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::transpose(&w1,0,1);
  for (sVar3 = 0; sVar3 != 3; sVar3 = sVar3 + 1) {
    for (sVar6 = 0; sVar6 != 4; sVar6 = sVar6 + 1) {
      for (uVar4 = 0; uVar4 != 2; uVar4 = uVar4 + 1) {
        piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)&v,sVar3,sVar6,uVar4);
        iVar1 = *piVar2;
        piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)&w1,sVar6,sVar3,uVar4);
        w3.data_._0_1_ = iVar1 == *piVar2;
        test((bool *)&w3);
      }
    }
  }
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&w1.geometry_);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&w2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&w2,3,(allocator_type *)&v);
  begin_01._M_current._4_4_ = w2.data_._4_4_;
  begin_01._M_current._0_4_ = w2.data_._0_4_;
  *begin_01._M_current = 3;
  begin_01._M_current[1] = 4;
  begin_01._M_current[2] = 2;
  w1.data_._0_4_ = 0;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_01,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )w2.geometry_._0_8_,data,(CoordinateOrder *)&w1,&andres::defaultOrder,
             (allocator_type *)&w3);
  begin_02._M_current._4_4_ = w2.data_._4_4_;
  begin_02._M_current._0_4_ = w2.data_._0_4_;
  w3.data_._0_4_ = 0;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&w1,begin_02,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )w2.geometry_._0_8_,data,(CoordinateOrder *)&w3,&andres::defaultOrder,
             (allocator_type *)&shape);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::transpose(&w1,0,1);
  for (sVar3 = 0; sVar3 != 3; sVar3 = sVar3 + 1) {
    for (sVar6 = 0; sVar6 != 4; sVar6 = sVar6 + 1) {
      for (uVar4 = 0; uVar4 != 2; uVar4 = uVar4 + 1) {
        piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)&v,sVar3,sVar6,uVar4);
        iVar1 = *piVar2;
        piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)&w1,sVar6,sVar3,uVar4);
        w3.data_._0_1_ = iVar1 == *piVar2;
        test((bool *)&w3);
      }
    }
  }
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&w1.geometry_);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&w2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&w2,3,(allocator_type *)&v);
  begin_03._M_current._4_4_ = w2.data_._4_4_;
  begin_03._M_current._0_4_ = w2.data_._0_4_;
  *begin_03._M_current = 3;
  begin_03._M_current[1] = 4;
  begin_03._M_current[2] = 2;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_03,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )w2.geometry_._0_8_,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&w1);
  begin_04._M_current._4_4_ = w2.data_._4_4_;
  begin_04._M_current._0_4_ = w2.data_._0_4_;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&w1,begin_04,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )w2.geometry_._0_8_,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&w3);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::transpose(&w1,0,2);
  for (sVar3 = 0; sVar3 != 3; sVar3 = sVar3 + 1) {
    for (uVar4 = 0; uVar4 != 4; uVar4 = uVar4 + 1) {
      for (sVar6 = 0; sVar6 != 2; sVar6 = sVar6 + 1) {
        piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)&v,sVar3,uVar4,sVar6);
        iVar1 = *piVar2;
        piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)&w1,sVar6,uVar4,sVar3);
        w3.data_._0_1_ = iVar1 == *piVar2;
        test((bool *)&w3);
      }
    }
  }
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&w1.geometry_);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&w2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&w2,3,(allocator_type *)&v);
  begin_05._M_current._4_4_ = w2.data_._4_4_;
  begin_05._M_current._0_4_ = w2.data_._0_4_;
  *begin_05._M_current = 3;
  begin_05._M_current[1] = 4;
  begin_05._M_current[2] = 2;
  w1.data_._0_4_ = 0;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_05,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )w2.geometry_._0_8_,data,(CoordinateOrder *)&w1,&andres::defaultOrder,
             (allocator_type *)&w3);
  begin_06._M_current._4_4_ = w2.data_._4_4_;
  begin_06._M_current._0_4_ = w2.data_._0_4_;
  w3.data_._0_4_ = 0;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&w1,begin_06,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )w2.geometry_._0_8_,data,(CoordinateOrder *)&w3,&andres::defaultOrder,
             (allocator_type *)&shape);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::transpose(&w1,0,2);
  for (sVar3 = 0; sVar3 != 3; sVar3 = sVar3 + 1) {
    for (uVar4 = 0; uVar4 != 4; uVar4 = uVar4 + 1) {
      for (sVar6 = 0; sVar6 != 2; sVar6 = sVar6 + 1) {
        piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)&v,sVar3,uVar4,sVar6);
        iVar1 = *piVar2;
        piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)&w1,sVar6,uVar4,sVar3);
        w3.data_._0_1_ = iVar1 == *piVar2;
        test((bool *)&w3);
      }
    }
  }
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&w1.geometry_);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&w2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&w2,3,(allocator_type *)&v);
  begin_07._M_current._4_4_ = w2.data_._4_4_;
  begin_07._M_current._0_4_ = w2.data_._0_4_;
  *begin_07._M_current = 3;
  begin_07._M_current[1] = 4;
  begin_07._M_current[2] = 2;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_07,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )w2.geometry_._0_8_,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&w1);
  begin_08._M_current._4_4_ = w2.data_._4_4_;
  begin_08._M_current._0_4_ = w2.data_._0_4_;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&w1,begin_08,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )w2.geometry_._0_8_,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&w3);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::transpose(&w1,1,2);
  for (sVar3 = 0; sVar3 != 3; sVar3 = sVar3 + 1) {
    for (uVar4 = 0; uVar4 != 4; uVar4 = uVar4 + 1) {
      for (uVar5 = 0; uVar5 != 2; uVar5 = uVar5 + 1) {
        piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)&v,sVar3,uVar4,uVar5);
        iVar1 = *piVar2;
        piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)&w1,sVar3,uVar5,uVar4);
        w3.data_._0_1_ = iVar1 == *piVar2;
        test((bool *)&w3);
      }
    }
  }
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&w1.geometry_);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&w2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&w2,3,(allocator_type *)&v);
  begin_09._M_current._4_4_ = w2.data_._4_4_;
  begin_09._M_current._0_4_ = w2.data_._0_4_;
  *begin_09._M_current = 3;
  begin_09._M_current[1] = 4;
  begin_09._M_current[2] = 2;
  w1.data_._0_4_ = 0;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_09,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )w2.geometry_._0_8_,data,(CoordinateOrder *)&w1,&andres::defaultOrder,
             (allocator_type *)&w3);
  begin_10._M_current._4_4_ = w2.data_._4_4_;
  begin_10._M_current._0_4_ = w2.data_._0_4_;
  w3.data_._0_4_ = 0;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&w1,begin_10,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )w2.geometry_._0_8_,data,(CoordinateOrder *)&w3,&andres::defaultOrder,
             (allocator_type *)&shape);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::transpose(&w1,1,2);
  for (sVar3 = 0; sVar3 != 3; sVar3 = sVar3 + 1) {
    for (uVar4 = 0; uVar4 != 4; uVar4 = uVar4 + 1) {
      for (uVar5 = 0; uVar5 != 2; uVar5 = uVar5 + 1) {
        piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)&v,sVar3,uVar4,uVar5);
        iVar1 = *piVar2;
        piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)&w1,sVar3,uVar5,uVar4);
        w3.data_._0_1_ = iVar1 == *piVar2;
        test((bool *)&w3);
      }
    }
  }
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&w1.geometry_);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&w2);
  return;
}

Assistant:

void ViewTest::transposeTest()
{
    // 2D
    {
        std::vector<std::size_t> shape(2);
        shape[0] = 6; 
        shape[1] = 4;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::View<int, constTarget> w1(shape.begin(), shape.end(), data_);
        andres::View<int, constTarget> w2(shape.begin(), shape.end(), data_);
        andres::View<int, constTarget> w3(shape.begin(), shape.end(), data_);
        w1.transpose(0,1);
        w2.transpose(0,0);
        w3.transpose(1,1);

        for(std::size_t x=0; x<6; ++x) {
            for(std::size_t y=0; y<4; ++y) {
                test(v(x, y) == w1(y, x));
                test(v(x, y) == w2(x, y));
                test(v(x, y) == w3(x, y));
            }
        }
    }
    {
        std::vector<std::size_t> shape(2);
        shape[0] = 6; 
        shape[1] = 4;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
        andres::View<int, constTarget> w1(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
        andres::View<int, constTarget> w2(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
        andres::View<int, constTarget> w3(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
        w1.transpose(0,1);
        w2.transpose(0,0);
        w3.transpose(1,1);

        for(std::size_t x=0; x<6; ++x) {
            for(std::size_t y=0; y<4; ++y) {
                test(v(x, y) == w1(y, x));
                test(v(x, y) == w2(x, y));
                test(v(x, y) == w3(x, y));
            }
        }
    }
    // 3D with...
    {
        // shape[0], shape[1]
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            andres::View<int, constTarget> w(shape.begin(), shape.end(), data_);
            w.transpose(0,1);

            for(std::size_t x=0; x<3; ++x) {
                for(std::size_t y=0; y<4; ++y) {
                    for(std::size_t z=0; z<2; ++z) {
                        test(v(x, y, z) == w(y, x, z));
                    }
                }
            }
        }
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
            andres::View<int, constTarget> w(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
            w.transpose(0,1);

            for(std::size_t x=0; x<3; ++x) {
                for(std::size_t y=0; y<4; ++y) {
                    for(std::size_t z=0; z<2; ++z) {
                        test(v(x, y, z) == w(y, x, z));
                    }
                }
            }
        }
        // shape[0], shape[2]
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            andres::View<int, constTarget> w(shape.begin(), shape.end(), data_);
            w.transpose(0,2);

            for(std::size_t x=0; x<3; ++x) {
                for(std::size_t y=0; y<4; ++y) {
                    for(std::size_t z=0; z<2; ++z) {

                        test(v(x, y, z) == w(z, y, x));
                    }
                }
            }
        }
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
            andres::View<int, constTarget> w(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
            w.transpose(0,2);

            for(std::size_t x=0; x<3; ++x) {
                for(std::size_t y=0; y<4; ++y) {
                    for(std::size_t z=0; z<2; ++z) {
                        test(v(x, y, z) == w(z, y, x));
                    }
                }
            }
        }
        // shape[1], shape[2]
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            andres::View<int, constTarget> w(shape.begin(), shape.end(), data_);
            w.transpose(1,2);

            for(std::size_t x=0; x<3; ++x) {
                for(std::size_t y=0; y<4; ++y) {
                    for(std::size_t z=0; z<2; ++z) {
                        test(v(x, y, z) == w(x, z, y));
                    }
                }
            }
        }
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
            andres::View<int, constTarget> w(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
            w.transpose(1,2);

            for(std::size_t x=0; x<3; ++x) {
                for(std::size_t y=0; y<4; ++y) {
                    for(std::size_t z=0; z<2; ++z) {
                        test(v(x, y, z) == w(x, z, y));
                    }
                }
            }
        }
    }
}